

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O0

int __thiscall ncnn::Normalize::load_param(Normalize *this,ParamDict *pd)

{
  int iVar1;
  ParamDict *in_RSI;
  long in_RDI;
  float fVar2;
  
  iVar1 = ParamDict::get(in_RSI,0,0);
  *(int *)(in_RDI + 0xd0) = iVar1;
  iVar1 = ParamDict::get(in_RSI,4,1);
  *(int *)(in_RDI + 0xd4) = iVar1;
  iVar1 = ParamDict::get(in_RSI,1,0);
  *(int *)(in_RDI + 0xd8) = iVar1;
  fVar2 = ParamDict::get(in_RSI,2,0.0001);
  *(float *)(in_RDI + 0xdc) = fVar2;
  iVar1 = ParamDict::get(in_RSI,9,0);
  *(int *)(in_RDI + 0xe4) = iVar1;
  iVar1 = ParamDict::get(in_RSI,3,0);
  *(int *)(in_RDI + 0xe0) = iVar1;
  return 0;
}

Assistant:

int Normalize::load_param(const ParamDict& pd)
{
    across_spatial = pd.get(0, 0);
    across_channel = pd.get(4, 1);
    channel_shared = pd.get(1, 0);
    eps = pd.get(2, 0.0001f);
    eps_mode = pd.get(9, 0);
    scale_data_size = pd.get(3, 0);

    return 0;
}